

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O2

void __thiscall
writer_test_should_write_utc_timestamp_field_Test::TestBody
          (writer_test_should_write_utc_timestamp_field_Test *this)

{
  size_t __n;
  char *message;
  ostringstream local_220 [8];
  ostringstream oss;
  tm local_a8;
  undefined1 local_70 [8];
  Field field;
  internal local_30 [8];
  AssertionResult gtest_ar;
  
  Fixpp::Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>::Field
            ((Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_> *)local_70);
  local_a8.tm_gmtoff = 0;
  local_a8.tm_zone = (char *)0x0;
  local_a8.tm_wday = 0;
  local_a8.tm_yday = 0;
  local_a8.tm_isdst = 0;
  local_a8._36_4_ = 0;
  local_a8.tm_mon = 4;
  local_a8.tm_year = 0x75;
  local_a8.tm_sec = 0x1e;
  local_a8.tm_min = 0x2d;
  local_a8.tm_hour = 0xd;
  local_a8.tm_mday = 0x10;
  local_70 = (undefined1  [8])mkgmtime(&local_a8);
  field.val_.m_time = 0;
  field.val_.m_msec.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_payload<int,_true,_true,_true>)0x0;
  field.val_.m_usec.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_payload._M_value._0_1_ = 0;
  std::__cxx11::ostringstream::ostringstream(local_220);
  Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>_>::write
            ((int)local_220,(Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_> *)local_70,__n);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[22]>
            (local_30,"oss.str()","\"52=20170516-13:45:30|\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field.empty_,
             (char (*) [22])"52=20170516-13:45:30|");
  std::__cxx11::string::~string((string *)&field.empty_);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&field.empty_);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
               ,0x8d,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&field.empty_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&field.empty_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  std::__cxx11::ostringstream::~ostringstream(local_220);
  return;
}

Assistant:

TEST(writer_test, should_write_utc_timestamp_field)
{
    using Field = Fixpp::Field<Fixpp::Tag::SendingTime>;
    Field field;

    std::tm tm{};
    tm.tm_year = 117;
    tm.tm_mon = 4;
    tm.tm_mday = 16;
    tm.tm_hour = 13;
    tm.tm_min = 45;
    tm.tm_sec = 30;

    auto ts = mkgmtime(&tm);
    field.set(ts);

    std::ostringstream oss;
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "52=20170516-13:45:30|");
}